

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_3_2::(anonymous_namespace)::jacobiRotateRight<float,0,1>
               (Matrix33<float> *A,float c,float s)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  Matrix33<float> *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float tau2;
  float tau1;
  int i;
  int local_14;
  
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    pfVar3 = Matrix33<float>::operator[](in_RDI,local_14);
    fVar1 = *pfVar3;
    pfVar3 = Matrix33<float>::operator[](in_RDI,local_14);
    fVar2 = pfVar3[1];
    pfVar3 = Matrix33<float>::operator[](in_RDI,local_14);
    *pfVar3 = in_XMM0_Da * fVar1 + -(in_XMM1_Da * fVar2);
    pfVar3 = Matrix33<float>::operator[](in_RDI,local_14);
    pfVar3[1] = in_XMM1_Da * fVar1 + in_XMM0_Da * fVar2;
  }
  return;
}

Assistant:

void
jacobiRotateRight (
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A, const T c, const T s)
{
    for (int i = 0; i < 3; ++i)
    {
        const T tau1 = A[i][j];
        const T tau2 = A[i][k];
        A[i][j]      = c * tau1 - s * tau2;
        A[i][k]      = s * tau1 + c * tau2;
    }
}